

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::BinsSelectionSyntax::setChild
          (BinsSelectionSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00a0d71c + *(int *)(&DAT_00a0d71c + index * 4)))();
  return;
}

Assistant:

void BinsSelectionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: name = child.token(); return;
        case 3: equals = child.token(); return;
        case 4: expr = child.node() ? &child.node()->as<BinsSelectExpressionSyntax>() : nullptr; return;
        case 5: iff = child.node() ? &child.node()->as<CoverageIffClauseSyntax>() : nullptr; return;
        case 6: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}